

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O0

double trento::anon_unknown_6::determine_asym(Nucleus *A,Nucleus *B)

{
  long *in_RSI;
  long *in_RDI;
  double dVar1;
  double sum;
  double rB;
  double rA;
  undefined8 local_8;
  
  local_8 = (double)(**(code **)(*in_RDI + 0x10))();
  dVar1 = (double)(**(code **)(*in_RSI + 0x10))();
  if (0.1 <= local_8 + dVar1) {
    local_8 = local_8 / (local_8 + dVar1);
  }
  else {
    local_8 = 0.5;
  }
  return local_8;
}

Assistant:

double determine_asym(const Nucleus& A, const Nucleus& B) {
  double rA = A.radius();
  double rB = B.radius();
  double sum = rA + rB;
  if (sum < 0.1)
    return 0.5;
  else
    return rA/sum;
}